

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O0

long __thiscall AmsRouter::ClosePort(AmsRouter *this,uint16_t port)

{
  bool bVar1;
  reference pvVar2;
  lock_guard<std::recursive_mutex> local_28;
  lock_guard<std::recursive_mutex> lock;
  uint16_t port_local;
  AmsRouter *this_local;
  
  lock._M_device._6_2_ = port;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_28,&this->mutex);
  if ((29999 < lock._M_device._6_2_) && (lock._M_device._6_2_ < 0x75b0)) {
    pvVar2 = std::array<AmsPort,_128UL>::operator[]
                       (&this->ports,(long)(int)(lock._M_device._6_2_ - 30000));
    bVar1 = AmsPort::IsOpen(pvVar2);
    if (bVar1) {
      pvVar2 = std::array<AmsPort,_128UL>::operator[]
                         (&this->ports,(long)(int)(lock._M_device._6_2_ - 30000));
      AmsPort::Close(pvVar2);
      this_local = (AmsRouter *)0x0;
      goto LAB_001a002e;
    }
  }
  this_local = (AmsRouter *)0x748;
LAB_001a002e:
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_28);
  return (long)this_local;
}

Assistant:

long AmsRouter::ClosePort(uint16_t port)
{
    std::lock_guard<std::recursive_mutex> lock(mutex);
    if ((port < PORT_BASE) || (port >= PORT_BASE + NUM_PORTS_MAX) || !ports[port - PORT_BASE].IsOpen()) {
        return ADSERR_CLIENT_PORTNOTOPEN;
    }
    ports[port - PORT_BASE].Close();
    return 0;
}